

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict
right_op(c2m_ctx_t c2m_ctx,int no_err_p,int token,int token2,nonterm_func_t left,
        nonterm_func_t right)

{
  int iVar1;
  node_t_conflict op;
  undefined1 local_60 [8];
  pos_t pos;
  node_t_conflict n;
  node_t_conflict r;
  nonterm_func_t p_Stack_38;
  node_code_t code;
  nonterm_func_t right_local;
  nonterm_func_t left_local;
  int local_20;
  int token2_local;
  int token_local;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  p_Stack_38 = right;
  right_local = left;
  left_local._4_4_ = token2;
  local_20 = token;
  token2_local = no_err_p;
  _token_local = c2m_ctx;
  n = (*left)(c2m_ctx,no_err_p);
  c2m_ctx_local = (c2m_ctx_t)n;
  if (n != &err_struct) {
    iVar1 = match(_token_local,local_20,(pos_t *)local_60,(node_code_t *)((long)&r + 4),
                  (node_t_conflict *)0x0);
    if ((iVar1 != 0) ||
       ((-1 < left_local._4_4_ &&
        (iVar1 = match(_token_local,left_local._4_4_,(pos_t *)local_60,(node_code_t *)((long)&r + 4)
                       ,(node_t_conflict *)0x0), iVar1 != 0)))) {
      pos._8_8_ = new_pos_node1(_token_local,r._4_4_,_local_60,n);
      op = (*p_Stack_38)(_token_local,token2_local);
      if (op == &err_struct) {
        return &err_struct;
      }
      op_append(_token_local,(node_t_conflict)pos._8_8_,op);
      n = (node_t_conflict)pos._8_8_;
    }
    c2m_ctx_local = (c2m_ctx_t)n;
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

static node_t right_op (c2m_ctx_t c2m_ctx, int no_err_p, int token, int token2, nonterm_func_t left,
                        nonterm_func_t right) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  P (left);
  if (MC (token, pos, code) || (token2 >= 0 && MC (token2, pos, code))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    P (right);
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}